

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

shared_ptr<kratos::DPIFunctionStmtBlock> __thiscall
kratos::Generator::dpi_function(Generator *this,string *func_name)

{
  iterator iVar1;
  UserException *this_00;
  key_type *in_RDX;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>,_bool>
  pVar2;
  shared_ptr<kratos::DPIFunctionStmtBlock> sVar3;
  basic_string_view<char> bVar4;
  string_view format_str;
  format_args args;
  pointer local_68;
  size_type sStack_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
                  *)(func_name[0x1d].field_2._M_local_buf + 8),in_RDX);
  if (iVar1._M_node == (_Base_ptr)(func_name + 0x1e)) {
    local_50._M_dataplus._M_p = (pointer)func_name;
    std::make_shared<kratos::DPIFunctionStmtBlock,kratos::Generator*,std::__cxx11::string_const&>
              ((Generator **)this,&local_50);
    local_50._M_dataplus._M_p._0_4_ = *(undefined4 *)&func_name[0x1f]._M_dataplus._M_p;
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_int_const,std::__cxx11::string>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
    ::_M_emplace_unique<unsigned_int,std::__cxx11::string_const&>
              ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_int_const,std::__cxx11::string>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
                *)&func_name[0x1f]._M_string_length,(uint *)&local_50,in_RDX);
    pVar2 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::FunctionStmtBlock>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::FunctionStmtBlock>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::FunctionStmtBlock>>>>
            ::
            _M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<kratos::DPIFunctionStmtBlock>&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::FunctionStmtBlock>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::FunctionStmtBlock>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::FunctionStmtBlock>>>>
                        *)(func_name[0x1d].field_2._M_local_buf + 8),in_RDX,
                       (shared_ptr<kratos::DPIFunctionStmtBlock> *)this);
    sVar3.super___shared_ptr<kratos::DPIFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = pVar2._8_8_;
    sVar3.super___shared_ptr<kratos::DPIFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<kratos::DPIFunctionStmtBlock>)
           sVar3.super___shared_ptr<kratos::DPIFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (UserException *)__cxa_allocate_exception(0x10);
  local_68 = (in_RDX->_M_dataplus)._M_p;
  sStack_60 = in_RDX->_M_string_length;
  bVar4 = fmt::v7::to_string_view<char,_0>("function {0} already exists");
  format_str.data_ = (char *)bVar4.size_;
  format_str.size_ = 0xd;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_68;
  fmt::v7::detail::vformat_abi_cxx11_(&local_50,(detail *)bVar4.data_,format_str,args);
  UserException::UserException(this_00,&local_50);
  __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<DPIFunctionStmtBlock> Generator::dpi_function(const std::string &func_name) {
    if (funcs_.find(func_name) != funcs_.end())
        throw UserException(::format("function {0} already exists", func_name));
    auto p = std::make_shared<DPIFunctionStmtBlock>(this, func_name);
    func_index_.emplace(static_cast<uint32_t>(funcs_.size()), func_name);
    funcs_.emplace(func_name, p);
    return p;
}